

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

void SparseKeygenRecurse<Blob<48>,Blob<128>>
               (pfHash hash,int start,int bitsleft,bool inclusive,Blob<48> *k,
               vector<Blob<128>,_std::allocator<Blob<128>_>_> *hashes)

{
  undefined1 in_CL;
  int in_EDX;
  uint32_t in_ESI;
  code *in_RDI;
  void *in_R8;
  Blob<48> *in_R9;
  int i;
  Blob<128> h;
  int nbits;
  int nbytes;
  uint32_t local_44;
  undefined1 local_40 [8];
  value_type *in_stack_ffffffffffffffc8;
  undefined4 uVar1;
  undefined4 uVar2;
  int in_stack_ffffffffffffffe8;
  undefined3 in_stack_ffffffffffffffec;
  uint start_00;
  uint32_t uVar3;
  
  start_00 = CONCAT13(in_CL,in_stack_ffffffffffffffec) & 0x1ffffff;
  uVar2 = 6;
  uVar1 = 0x30;
  local_44 = in_ESI;
  Blob<128>::Blob((Blob<128> *)local_40);
  uVar3 = local_44;
  for (; (int)local_44 < 0x30; local_44 = local_44 + 1) {
    flipbit(in_R8,6,local_44);
    if (((start_00 & 0x1000000) != 0) || (in_EDX == 1)) {
      (*in_RDI)(in_R8,6,0,local_40);
      std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::push_back
                ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)CONCAT44(uVar2,uVar1),
                 in_stack_ffffffffffffffc8);
    }
    if (1 < in_EDX) {
      SparseKeygenRecurse<Blob<48>,Blob<128>>
                ((pfHash)CONCAT44(uVar3,in_EDX),start_00,in_stack_ffffffffffffffe8,
                 SUB81((ulong)in_R8 >> 0x38,0),in_R9,
                 (vector<Blob<128>,_std::allocator<Blob<128>_>_> *)CONCAT44(uVar2,uVar1));
    }
    flipbit(in_R8,6,local_44);
  }
  return;
}

Assistant:

void SparseKeygenRecurse ( pfHash hash, int start, int bitsleft, bool inclusive, keytype & k, std::vector<hashtype> & hashes )
{
  const int nbytes = sizeof(keytype);
  const int nbits = nbytes * 8;

  hashtype h;

  for(int i = start; i < nbits; i++)
  {
    flipbit(&k, nbytes, i);

    if(inclusive || (bitsleft == 1))
    {
      hash(&k, sizeof(keytype), 0, &h);
      hashes.push_back(h);
    }

    if(bitsleft > 1)
    {
      SparseKeygenRecurse(hash, i+1, bitsleft-1, inclusive, k, hashes);
    }

    flipbit(&k, nbytes, i);
  }
}